

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_request_method_common.c
# Opt level: O3

char * nhr_request_url_encoded_parameters(_nhr_map_node *map,size_t *length)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *__format;
  
  sVar2 = nhr_request_map_strings_length(map,2);
  if (sVar2 == 0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = (char *)nhr_malloc(sVar2);
    if (map == (_nhr_map_node *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = 0;
      do {
        __format = "&%s=%s";
        if (sVar2 == 0) {
          __format = "%s=%s";
        }
        iVar1 = sprintf(pcVar3 + sVar2,__format,map->key,(map->value).data);
        sVar2 = sVar2 + (long)iVar1;
        map = map->next;
      } while (map != (_nhr_map_node_struct *)0x0);
    }
    pcVar3[sVar2] = '\0';
    *length = sVar2;
  }
  return pcVar3;
}

Assistant:

char * nhr_request_url_encoded_parameters(_nhr_map_node * map, size_t * length) {
	size_t buff_size = nhr_request_map_strings_length(map, 2); // `&` + `=`
	size_t writed = 0;
	_nhr_map_node * cur = map;
	char * buff = NULL;

	if (buff_size == 0) {
		return NULL;
	}
	buff = (char *)nhr_malloc(buff_size); // null terminated included
	
	while (cur) {
		writed += nhr_sprintf(buff + writed, buff_size - writed, writed > 0 ? "&%s=%s" : "%s=%s", cur->key, cur->value.string);
		cur = cur->next;
	}
	buff[writed] = 0;
	*length = writed;
	return buff;
}